

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::HeapEntry<duckdb::string_t>::Assign
          (HeapEntry<duckdb::string_t> *this,ArenaAllocator *allocator,string_t *new_val)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  data_ptr_t pdVar5;
  ulong len;
  InvalidInputException *this_00;
  char *pcVar6;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_38 [16];
  
  uVar1 = (new_val->value).pointer.length;
  uVar4 = (ulong)uVar1;
  if (uVar4 < 0xd) {
    pcVar6 = (new_val->value).pointer.ptr;
    *(undefined8 *)&(this->value).value = *(undefined8 *)&new_val->value;
    (this->value).value.pointer.ptr = pcVar6;
  }
  else if (this->allocated_data == (data_ptr_t)0x0) {
    len = duckdb::NextPowerOfTwo(uVar4);
    if (len >> 0x20 != 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Resulting string/blob too large!","");
      duckdb::InvalidInputException::InvalidInputException(this_00,(string *)&local_48);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    this->capacity = (uint32_t)len;
    pdVar5 = ArenaAllocator::Allocate(allocator,len);
    this->allocated_data = pdVar5;
    if ((new_val->value).pointer.length < 0xd) {
      pcVar6 = (char *)((long)&new_val->value + 4);
    }
    else {
      pcVar6 = (new_val->value).pointer.ptr;
    }
    memcpy(pdVar5,pcVar6,uVar4);
    pdVar5 = this->allocated_data;
    uVar3 = *(undefined4 *)pdVar5;
    (this->value).value.pointer.length = uVar1;
    *(undefined4 *)((long)&(this->value).value + 4) = uVar3;
    (this->value).value.pointer.ptr = (char *)pdVar5;
  }
  else {
    uVar2 = this->capacity;
    uVar4 = (ulong)uVar2;
    if (uVar2 < uVar1) {
      do {
        uVar1 = (int)uVar4 * 2;
        this->capacity = uVar1;
        uVar4 = (ulong)uVar1;
      } while (uVar1 < (new_val->value).pointer.length);
      pdVar5 = (data_ptr_t)
               duckdb::ArenaAllocator::Reallocate
                         ((uchar *)allocator,(ulong)this->allocated_data,(ulong)uVar2);
      this->allocated_data = pdVar5;
    }
    uVar1 = (new_val->value).pointer.length;
    uVar4 = (ulong)uVar1;
    if (uVar4 < 0xd) {
      pcVar6 = (char *)((long)&new_val->value + 4);
    }
    else {
      pcVar6 = (new_val->value).pointer.ptr;
    }
    memcpy(this->allocated_data,pcVar6,uVar4);
    pdVar5 = this->allocated_data;
    if (uVar4 < 0xd) {
      local_40 = 0;
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      if (uVar1 != 0) {
        memcpy(&local_48,pdVar5,uVar4);
      }
    }
    else {
      local_48._0_4_ = *(undefined4 *)pdVar5;
      local_48._4_4_ = SUB84(pdVar5,0);
      local_40 = (undefined4)((ulong)pdVar5 >> 0x20);
    }
    (this->value).value.pointer.length = uVar1;
    *(ulong *)((long)&(this->value).value + 4) = CONCAT44(local_48._4_4_,(undefined4)local_48);
    *(undefined4 *)((long)&(this->value).value + 0xc) = local_40;
  }
  return;
}

Assistant:

void Assign(ArenaAllocator &allocator, const string_t &new_val) {
		if (new_val.IsInlined()) {
			value = new_val;
			return;
		}

		// Short path for first assignment
		if (allocated_data == nullptr) {
			auto new_size = UnsafeNumericCast<uint32_t>(new_val.GetSize());
			auto new_capacity = NextPowerOfTwo(new_size);
			if (new_capacity > string_t::MAX_STRING_SIZE) {
				throw InvalidInputException("Resulting string/blob too large!");
			}
			capacity = UnsafeNumericCast<uint32_t>(new_capacity);
			allocated_data = allocator.Allocate(capacity);
			memcpy(allocated_data, new_val.GetData(), new_size);
			value = string_t(const_char_ptr_cast(allocated_data), new_size);
			return;
		}

		// double allocation until value fits
		if (capacity < new_val.GetSize()) {
			auto old_size = capacity;
			capacity *= 2;
			while (capacity < new_val.GetSize()) {
				capacity *= 2;
			}
			allocated_data = allocator.Reallocate(allocated_data, old_size, capacity);
		}
		auto new_size = UnsafeNumericCast<uint32_t>(new_val.GetSize());
		memcpy(allocated_data, new_val.GetData(), new_size);
		value = string_t(const_char_ptr_cast(allocated_data), new_size);
	}